

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtHashMap.h
# Opt level: O3

int __thiscall
cbtHashMap<cbtHashInt,_cbtTriangleInfo>::findIndex
          (cbtHashMap<cbtHashInt,_cbtTriangleInfo> *this,cbtHashInt *key)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  
  iVar1 = key->m_uid;
  uVar2 = ~(iVar1 << 0xf) + iVar1;
  uVar2 = (uVar2 >> 10 ^ uVar2) * 9;
  uVar2 = uVar2 >> 6 ^ uVar2;
  uVar2 = ~(uVar2 << 0xb) + uVar2;
  uVar4 = (long)(int)(uVar2 >> 0x10 ^ uVar2) & (long)(this->m_valueArray).m_capacity - 1U;
  if (((uint)uVar4 < (uint)(this->m_hashTable).m_size) &&
     (iVar3 = (this->m_hashTable).m_data[uVar4], iVar3 != -1)) {
    do {
      if (iVar1 == (this->m_keyArray).m_data[iVar3].m_uid) {
        return iVar3;
      }
      iVar3 = (this->m_next).m_data[iVar3];
    } while (iVar3 != -1);
  }
  return -1;
}

Assistant:

SIMD_FORCE_INLINE unsigned int getHash() const
	{
		unsigned int key = m_uid;
		// Thomas Wang's hash
		key += ~(key << 15);
		key ^= (key >> 10);
		key += (key << 3);
		key ^= (key >> 6);
		key += ~(key << 11);
		key ^= (key >> 16);

		return key;
	}